

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::forward
          (DeconvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  size_t sVar19;
  void *pvVar20;
  undefined4 *puVar21;
  Layer *pLVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  bool bVar26;
  Mat *pMVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  float *pfVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  ulong uVar47;
  void *pvVar48;
  long lVar49;
  ulong uVar50;
  size_t sVar51;
  int x;
  int _w;
  int iVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  float fVar66;
  float fVar67;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar78 [28];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar114 [16];
  float fVar112;
  float fVar113;
  float fVar129;
  float fVar131;
  float fVar133;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar132;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar128;
  float fVar130;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 in_ZMM7 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  float fVar147;
  undefined1 auVar146 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar152 [64];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [32];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_2f8;
  uint local_2d8;
  ulong local_2c8;
  int local_298;
  int iStack_294;
  int local_258;
  undefined1 auStack_254 [12];
  void *local_240;
  Mat local_238;
  undefined8 local_1e8;
  void *local_1d0;
  Mat local_1c8;
  Mat *local_180;
  Mat local_178;
  long local_130;
  void *local_128;
  void *local_120;
  long local_118;
  long local_110;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  void *local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar97 [32];
  undefined1 auVar100 [32];
  undefined1 auVar127 [32];
  undefined1 auVar153 [64];
  
  uVar50 = bottom_blob->elemsize;
  iVar41 = bottom_blob->elempack;
  uVar29 = 1;
  if (opt->use_packing_layout == true) {
    uVar35 = (this->super_DeconvolutionDepthWise).num_output;
    uVar29 = 8;
    if ((uVar35 & 7) != 0) {
      uVar29 = (uint)((uVar35 & 3) == 0) * 3 + 1;
    }
  }
  uVar4 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  auVar149._4_4_ = uVar9;
  auVar149._0_4_ = uVar4;
  uVar5 = (this->super_DeconvolutionDepthWise).kernel_w;
  uVar10 = (this->super_DeconvolutionDepthWise).kernel_h;
  auVar109._4_4_ = uVar10;
  auVar109._0_4_ = uVar5;
  uVar6 = (this->super_DeconvolutionDepthWise).dilation_w;
  uVar11 = (this->super_DeconvolutionDepthWise).dilation_h;
  auVar84._4_4_ = uVar11;
  auVar84._0_4_ = uVar6;
  uVar7 = (this->super_DeconvolutionDepthWise).stride_w;
  uVar12 = (this->super_DeconvolutionDepthWise).stride_h;
  auVar104._4_4_ = uVar12;
  auVar104._0_4_ = uVar7;
  uVar35 = bottom_blob->c;
  uVar38 = (ulong)uVar35;
  uVar8 = (this->super_DeconvolutionDepthWise).output_pad_right;
  uVar13 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  auVar107._4_4_ = uVar13;
  auVar107._0_4_ = uVar8;
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  auVar86._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar86._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar86._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar86._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  auVar114 = vpcmpgtd_avx(auVar86,(undefined1  [16])0x0);
  lVar49 = 0x10;
  if (((((auVar114 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar114 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar114 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar114[0xf])
     && ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
          ((this->super_DeconvolutionDepthWise).output_h < 1)) &&
         (lVar49 = 8, &local_238 != top_blob)))) {
    piVar18 = top_blob->refcount;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + 1;
      UNLOCK();
    }
    local_238.data = top_blob->data;
    local_238.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_238.elemsize = top_blob->elemsize;
    local_238.elempack = top_blob->elempack;
    local_238.allocator = top_blob->allocator;
    auVar114._0_4_ = top_blob->dims;
    auVar114._4_4_ = top_blob->w;
    uVar14 = top_blob->h;
    uVar15 = top_blob->d;
    auVar114._8_8_ = CONCAT44(uVar15,uVar14);
    local_238.c = top_blob->c;
    local_238.cstep = top_blob->cstep;
    local_238.dims = auVar114._0_4_;
    local_238.w = auVar114._4_4_;
    local_238._48_8_ = auVar114._8_8_;
  }
  auVar109._8_8_ = 0;
  auVar107._8_8_ = 0;
  auVar104._8_8_ = 0;
  auVar149._8_8_ = 0;
  auVar84._8_8_ = 0;
  auVar114 = vpcmpeqd_avx(auVar114,auVar114);
  auVar86 = vpaddd_avx(auVar109,auVar114);
  auVar84 = vpmulld_avx(auVar86,auVar84);
  auVar102 = ZEXT1664(auVar84);
  auVar86 = vpaddd_avx(auVar149,auVar114);
  auVar86 = vpmulld_avx(auVar104,auVar86);
  auVar86 = vpaddd_avx(auVar84,auVar86);
  auVar86 = vpaddd_avx(auVar86,auVar107);
  auVar86 = vpsubd_avx(auVar86,auVar114);
  sVar51 = (uVar50 / (ulong)(long)iVar41) * (ulong)uVar29;
  _w = auVar86._0_4_;
  iVar40 = auVar86._4_4_;
  Mat::create(&local_238,_w,iVar40,(this->super_DeconvolutionDepthWise).num_output / (int)uVar29,
              sVar51,uVar29,*(Allocator **)(&opt->lightmode + lVar49));
  iVar37 = -100;
  local_180 = top_blob;
  if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
  goto LAB_00439161;
  iVar37 = (this->super_DeconvolutionDepthWise).num_output;
  iVar28 = (this->super_DeconvolutionDepthWise).group;
  if (iVar28 == iVar37 && iVar41 * uVar35 == iVar28) {
    iVar28 = (this->super_DeconvolutionDepthWise).kernel_h *
             (this->super_DeconvolutionDepthWise).kernel_w;
    iVar52 = auVar84._0_4_;
    iVar37 = auVar84._4_4_;
    if (iVar41 == 1) {
      if (0 < (int)uVar35) {
        local_118 = local_238.cstep * local_238.elemsize;
        local_120 = local_238.data;
        local_240 = (this->weight_data_tm).data;
        iVar41 = bottom_blob->w;
        local_128 = bottom_blob->data;
        sVar51 = bottom_blob->elemsize;
        local_130 = bottom_blob->cstep * sVar51;
        auVar86 = vpcmpgtd_avx(auVar86,(undefined1  [16])0x0);
        auVar86 = vpmovsxdq_avx(auVar86);
        uVar29 = vmovmskpd_avx(auVar86);
        local_110 = (long)iVar28 << 2;
        local_2f8 = 0;
        do {
          if ((byte)((byte)uVar29 >> 1) != 0) {
            local_1e8 = (void *)(local_130 * local_2f8 + (long)local_128);
            pfVar39 = (float *)(local_118 * local_2f8 + (long)local_120);
            uVar35 = (this->super_DeconvolutionDepthWise).kernel_h;
            iVar28 = (this->super_DeconvolutionDepthWise).bias_term;
            iVar34 = (this->super_DeconvolutionDepthWise).activation_type;
            iVar42 = 0;
            do {
              if ((uVar29 & 1) != 0) {
                local_1d0 = (this->super_DeconvolutionDepthWise).bias_data.data;
                iVar30 = (this->super_DeconvolutionDepthWise).dilation_h;
                pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                iVar43 = 0;
                local_258 = -iVar52;
                do {
                  if (iVar28 == 0) {
                    auVar102 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar102 = ZEXT464(*(uint *)((long)local_1d0 + local_2f8 * 4));
                  }
                  auVar86 = auVar102._0_16_;
                  if (0 < (int)uVar35) {
                    iVar16 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar36 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar17 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar50 = 0;
                    pvVar48 = local_240;
                    do {
                      iVar31 = iVar30 * (int)uVar50 + (iVar42 - iVar37);
                      if (((-1 < iVar31) &&
                          (iVar32 = iVar31 / iVar16, iVar32 < (int)uVar9 && iVar31 % iVar16 == 0))
                         && (0 < (int)uVar36)) {
                        uVar46 = 0;
                        iVar31 = local_258;
                        do {
                          if ((-1 < iVar31) &&
                             (iVar33 = iVar31 / iVar17, iVar33 < (int)uVar4 && iVar31 % iVar17 == 0)
                             ) {
                            auVar102 = ZEXT464((uint)(*(float *)((long)pvVar48 + uVar46 * 4) *
                                                      *(float *)((long)local_1e8 +
                                                                (long)iVar33 * 4 +
                                                                (long)iVar32 * (long)iVar41 * sVar51
                                                                ) + auVar102._0_4_));
                          }
                          uVar46 = uVar46 + 1;
                          iVar31 = iVar31 + (this->super_DeconvolutionDepthWise).dilation_w;
                        } while (uVar36 != uVar46);
                      }
                      auVar86 = auVar102._0_16_;
                      uVar50 = uVar50 + 1;
                      pvVar48 = (void *)((long)pvVar48 + (ulong)uVar36 * 4);
                    } while (uVar50 != uVar35);
                  }
                  fVar103 = auVar86._0_4_;
                  fVar53 = fVar103;
                  switch(iVar34) {
                  case 1:
                    auVar86 = vmaxss_avx(auVar86,ZEXT416(0));
                    fVar53 = auVar86._0_4_;
                    break;
                  case 2:
                    auVar86 = vcmpss_avx(ZEXT816(0) << 0x40,auVar86,1);
                    auVar77._8_4_ = 0x3f800000;
                    auVar77._0_8_ = 0x3f8000003f800000;
                    auVar77._12_4_ = 0x3f800000;
                    auVar86 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar77,auVar86);
                    fVar53 = auVar86._0_4_ * fVar103;
                    break;
                  case 3:
                    auVar86 = vmaxss_avx(auVar86,ZEXT416((uint)*pfVar1));
                    fVar53 = auVar86._0_4_;
                    if (pfVar1[1] < auVar86._0_4_) {
                      fVar53 = pfVar1[1];
                    }
                    break;
                  case 4:
                    auVar86 = vminss_avx(auVar86,ZEXT416(0x42b0c0a5));
                    auVar65._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                    auVar65._8_4_ = auVar86._8_4_ ^ 0x80000000;
                    auVar65._12_4_ = auVar86._12_4_ ^ 0x80000000;
                    auVar86 = vcmpss_avx(auVar86,ZEXT416(0xc2b0c0a5),1);
                    auVar76._8_4_ = 0x42b0c0a5;
                    auVar76._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar76._12_4_ = 0x42b0c0a5;
                    auVar86 = vblendvps_avx(auVar65,auVar76,auVar86);
                    fVar53 = expf(auVar86._0_4_);
                    fVar53 = 1.0 / (fVar53 + 1.0);
                    break;
                  case 5:
                    fVar53 = expf(fVar103);
                    fVar53 = logf(fVar53 + 1.0);
                    fVar53 = tanhf(fVar53);
                    fVar53 = fVar53 * fVar103;
                    break;
                  case 6:
                    fVar3 = *pfVar1;
                    fVar83 = -pfVar1[1] / fVar3;
                    fVar53 = 0.0;
                    if ((fVar83 <= fVar103) && (fVar53 = fVar103, fVar103 <= fVar83 + 1.0 / fVar3))
                    {
                      fVar53 = (fVar3 * fVar103 + pfVar1[1]) * fVar103;
                    }
                  }
                  *pfVar39 = fVar53;
                  pfVar39 = pfVar39 + 1;
                  iVar43 = iVar43 + 1;
                  local_258 = local_258 + 1;
                } while (iVar43 != _w);
              }
              iVar42 = iVar42 + 1;
            } while (iVar42 != iVar40);
          }
          local_2f8 = local_2f8 + 1;
          local_240 = (void *)((long)local_240 + local_110);
        } while (local_2f8 != uVar38);
      }
    }
    else if (iVar41 == 4) {
      if (0 < (int)uVar35) {
        auVar86 = vpcmpgtd_avx(auVar86,(undefined1  [16])0x0);
        auVar86 = vpmovsxdq_avx(auVar86);
        uVar29 = vmovmskpd_avx(auVar86);
        local_2c8 = 0;
        auVar110._8_4_ = 0x3f000000;
        auVar110._0_8_ = 0x3f0000003f000000;
        auVar110._12_4_ = 0x3f000000;
        auVar102 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if ((byte)((byte)uVar29 >> 1) != 0) {
            pvVar48 = (this->weight_data_tm).data;
            sVar51 = bottom_blob->cstep;
            sVar19 = bottom_blob->elemsize;
            pvVar20 = bottom_blob->data;
            iVar41 = bottom_blob->w;
            pauVar45 = (undefined1 (*) [16])
                       (local_238.cstep * local_2c8 * local_238.elemsize + (long)local_238.data);
            local_1d0 = (void *)(local_2c8 * 0x10);
            iVar34 = 0;
            do {
              if ((uVar29 & 1) != 0) {
                iVar30 = 0;
                iVar42 = -iVar52;
                do {
                  if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                    auVar62 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar62 = *(undefined1 (*) [16])
                               ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                               (long)local_1d0);
                  }
                  auVar106 = ZEXT1664(auVar62);
                  iVar43 = (this->super_DeconvolutionDepthWise).kernel_h;
                  if (0 < iVar43) {
                    iVar16 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar35 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar17 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar50 = 0;
                    lVar49 = 0;
                    do {
                      iVar31 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar49 +
                               (iVar34 - iVar37);
                      if ((((-1 < iVar31) && (iVar32 = iVar31 / iVar16, iVar31 % iVar16 == 0)) &&
                          (iVar32 < (int)uVar9)) && (0 < (int)uVar35)) {
                        uVar46 = (ulong)uVar35;
                        uVar47 = uVar50;
                        iVar31 = iVar42;
                        do {
                          if ((-1 < iVar31) &&
                             (iVar33 = iVar31 / iVar17, iVar33 < (int)uVar4 && iVar31 % iVar17 == 0)
                             ) {
                            pfVar39 = (float *)((long)pvVar48 +
                                               (uVar47 & 0xffffffff) * 4 +
                                               (long)(iVar28 * 4 * (int)local_2c8) * 4);
                            pfVar1 = (float *)((long)pvVar20 +
                                              (long)(iVar33 << 2) * 4 +
                                              (long)iVar32 * (long)iVar41 * sVar19 +
                                              sVar51 * local_2c8 * sVar19);
                            auVar106 = ZEXT1664(CONCAT412(pfVar39[3] * pfVar1[3] + auVar106._12_4_,
                                                          CONCAT48(pfVar39[2] * pfVar1[2] +
                                                                   auVar106._8_4_,
                                                                   CONCAT44(pfVar39[1] * pfVar1[1] +
                                                                            auVar106._4_4_,
                                                                            *pfVar39 * *pfVar1 +
                                                                            auVar106._0_4_))));
                          }
                          iVar31 = iVar31 + (this->super_DeconvolutionDepthWise).dilation_w;
                          uVar47 = uVar47 + 4;
                          uVar46 = uVar46 - 1;
                        } while (uVar46 != 0);
                      }
                      auVar62 = auVar106._0_16_;
                      lVar49 = lVar49 + 1;
                      uVar50 = uVar50 + (ulong)uVar35 * 4;
                    } while (lVar49 != iVar43);
                  }
                  auVar86 = auVar102._0_16_;
                  fVar53 = auVar102._0_4_;
                  fVar103 = auVar102._4_4_;
                  fVar3 = auVar102._8_4_;
                  fVar83 = auVar102._12_4_;
                  fVar60 = auVar62._4_4_;
                  fVar66 = auVar62._8_4_;
                  fVar67 = auVar62._12_4_;
                  switch((this->super_DeconvolutionDepthWise).activation_type) {
                  case 1:
                    auVar62 = vmaxps_avx(auVar62,_DAT_005a3040);
                    break;
                  case 2:
                    auVar86 = vmaxps_avx(auVar62,(undefined1  [16])0x0);
                    auVar114 = vminps_avx(auVar62,(undefined1  [16])0x0);
                    fVar53 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                    auVar62._0_4_ = fVar53 * auVar114._0_4_ + auVar86._0_4_;
                    auVar62._4_4_ = fVar53 * auVar114._4_4_ + auVar86._4_4_;
                    auVar62._8_4_ = fVar53 * auVar114._8_4_ + auVar86._8_4_;
                    auVar62._12_4_ = fVar53 * auVar114._12_4_ + auVar86._12_4_;
                    break;
                  case 3:
                    puVar21 = (undefined4 *)
                              (this->super_DeconvolutionDepthWise).activation_params.data;
                    uVar2 = *puVar21;
                    auVar120._4_4_ = uVar2;
                    auVar120._0_4_ = uVar2;
                    auVar120._8_4_ = uVar2;
                    auVar120._12_4_ = uVar2;
                    uVar2 = puVar21[1];
                    auVar162._4_4_ = uVar2;
                    auVar162._0_4_ = uVar2;
                    auVar162._8_4_ = uVar2;
                    auVar162._12_4_ = uVar2;
                    auVar86 = vmaxps_avx(auVar62,auVar120);
                    auVar62 = vminps_avx(auVar162,auVar86);
                    break;
                  case 4:
                    auVar63._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
                    auVar63._8_4_ = -fVar66;
                    auVar63._12_4_ = -fVar67;
                    auVar73._8_4_ = 0x42b0c0a5;
                    auVar73._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar73._12_4_ = 0x42b0c0a5;
                    auVar114 = vminps_avx(auVar63,auVar73);
                    auVar74._8_4_ = 0xc2b0c0a5;
                    auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar74._12_4_ = 0xc2b0c0a5;
                    auVar84 = vmaxps_avx(auVar114,auVar74);
                    auVar121._0_4_ = auVar84._0_4_ * 1.442695 + 0.5;
                    auVar121._4_4_ = auVar84._4_4_ * 1.442695 + 0.5;
                    auVar121._8_4_ = auVar84._8_4_ * 1.442695 + 0.5;
                    auVar121._12_4_ = auVar84._12_4_ * 1.442695 + 0.5;
                    auVar163._0_4_ = (int)auVar121._0_4_;
                    auVar163._4_4_ = (int)auVar121._4_4_;
                    auVar163._8_4_ = (int)auVar121._8_4_;
                    auVar163._12_4_ = (int)auVar121._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar163);
                    auVar114 = vcmpps_avx(auVar121,auVar149,1);
                    auVar114 = vandps_avx(auVar114,auVar86);
                    auVar114 = vsubps_avx(auVar149,auVar114);
                    fVar60 = auVar114._0_4_ * -0.6931472 + auVar84._0_4_;
                    fVar66 = auVar114._4_4_ * -0.6931472 + auVar84._4_4_;
                    fVar67 = auVar114._8_4_ * -0.6931472 + auVar84._8_4_;
                    fVar68 = auVar114._12_4_ * -0.6931472 + auVar84._12_4_;
                    auVar122._0_4_ = (int)auVar114._0_4_;
                    auVar122._4_4_ = (int)auVar114._4_4_;
                    auVar122._8_4_ = (int)auVar114._8_4_;
                    auVar122._12_4_ = (int)auVar114._12_4_;
                    auVar114 = vpslld_avx(auVar122,0x17);
                    auVar114 = vpaddd_avx(auVar114,auVar86);
                    auVar64._0_4_ =
                         (fVar60 * fVar60 *
                          (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) *
                             fVar60 + 0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) +
                         fVar60 + fVar53) * auVar114._0_4_ + fVar53;
                    auVar64._4_4_ =
                         (fVar66 * fVar66 *
                          (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) *
                             fVar66 + 0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) +
                         fVar66 + fVar103) * auVar114._4_4_ + fVar103;
                    auVar64._8_4_ =
                         (fVar67 * fVar67 *
                          (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) *
                             fVar67 + 0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) +
                         fVar67 + fVar3) * auVar114._8_4_ + fVar3;
                    auVar64._12_4_ =
                         (fVar68 * fVar68 *
                          (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                             fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) +
                         fVar68 + fVar83) * auVar114._12_4_ + fVar83;
                    auVar62 = vdivps_avx(auVar86,auVar64);
                    break;
                  case 5:
                    auVar105._8_4_ = 0x42b0c0a5;
                    auVar105._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar105._12_4_ = 0x42b0c0a5;
                    auVar114 = vminps_avx(auVar62,auVar105);
                    auVar141._8_4_ = 0xc2b0c0a5;
                    auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar141._12_4_ = 0xc2b0c0a5;
                    auVar84 = vmaxps_avx(auVar141,auVar114);
                    auVar148._0_4_ = auVar84._0_4_ * 1.442695 + 0.5;
                    auVar148._4_4_ = auVar84._4_4_ * 1.442695 + 0.5;
                    auVar148._8_4_ = auVar84._8_4_ * 1.442695 + 0.5;
                    auVar148._12_4_ = auVar84._12_4_ * 1.442695 + 0.5;
                    auVar160._0_4_ = (int)auVar148._0_4_;
                    auVar160._4_4_ = (int)auVar148._4_4_;
                    auVar160._8_4_ = (int)auVar148._8_4_;
                    auVar160._12_4_ = (int)auVar148._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar160);
                    auVar114 = vcmpps_avx(auVar148,auVar149,1);
                    auVar114 = vandps_avx(auVar114,auVar86);
                    auVar114 = vsubps_avx(auVar149,auVar114);
                    auVar161._0_4_ = auVar114._0_4_ * 0.6931472;
                    auVar161._4_4_ = auVar114._4_4_ * 0.6931472;
                    auVar161._8_4_ = auVar114._8_4_ * 0.6931472;
                    auVar161._12_4_ = auVar114._12_4_ * 0.6931472;
                    auVar149 = vsubps_avx(auVar84,auVar161);
                    fVar68 = auVar149._0_4_;
                    fVar113 = auVar149._4_4_;
                    fVar129 = auVar149._8_4_;
                    fVar131 = auVar149._12_4_;
                    auVar116._0_4_ = (int)auVar114._0_4_;
                    auVar116._4_4_ = (int)auVar114._4_4_;
                    auVar116._8_4_ = (int)auVar114._8_4_;
                    auVar116._12_4_ = (int)auVar114._12_4_;
                    auVar114 = vpslld_avx(auVar116,0x17);
                    auVar114 = vpaddd_avx(auVar114,auVar86);
                    auVar117._0_4_ =
                         (fVar68 + fVar53 +
                         fVar68 * fVar68 *
                         (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                            fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5)) *
                         auVar114._0_4_ + fVar53;
                    auVar117._4_4_ =
                         (fVar113 + fVar103 +
                         fVar113 * fVar113 *
                         (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) *
                            fVar113 + 0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) *
                         auVar114._4_4_ + fVar103;
                    auVar117._8_4_ =
                         (fVar129 + fVar3 +
                         fVar129 * fVar129 *
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) *
                         auVar114._8_4_ + fVar3;
                    auVar117._12_4_ =
                         (fVar131 + fVar83 +
                         fVar131 * fVar131 *
                         (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) *
                            fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) *
                         auVar114._12_4_ + fVar83;
                    auVar69._8_4_ = 0x800000;
                    auVar69._0_8_ = 0x80000000800000;
                    auVar69._12_4_ = 0x800000;
                    auVar114 = vmaxps_avx(auVar117,auVar69);
                    auVar149 = vpsrld_avx(auVar114,0x17);
                    auVar88._8_4_ = 0xffffff82;
                    auVar88._0_8_ = 0xffffff82ffffff82;
                    auVar88._12_4_ = 0xffffff82;
                    auVar149 = vpaddd_avx(auVar149,auVar88);
                    auVar89._8_4_ = 0x807fffff;
                    auVar89._0_8_ = 0x807fffff807fffff;
                    auVar89._12_4_ = 0x807fffff;
                    auVar114 = vandps_avx(auVar114,auVar89);
                    auVar104 = vorps_avx(auVar114,auVar110);
                    auVar84 = vcvtdq2ps_avx(auVar149);
                    auVar90._8_4_ = 0x3f3504f3;
                    auVar90._0_8_ = 0x3f3504f33f3504f3;
                    auVar90._12_4_ = 0x3f3504f3;
                    auVar149 = vcmpps_avx(auVar104,auVar90,1);
                    auVar114 = vandps_avx(auVar149,auVar104);
                    fVar68 = auVar104._0_4_ + -1.0 + auVar114._0_4_;
                    fVar113 = auVar104._4_4_ + -1.0 + auVar114._4_4_;
                    fVar129 = auVar104._8_4_ + -1.0 + auVar114._8_4_;
                    fVar131 = auVar104._12_4_ + -1.0 + auVar114._12_4_;
                    auVar114 = vandps_avx(auVar149,auVar86);
                    auVar149 = vsubps_avx(auVar84,auVar114);
                    auVar114 = vcmpps_avx(auVar117,_DAT_005a3040,2);
                    auVar70._0_4_ =
                         (fVar68 * fVar68 *
                          (((((((((fVar68 * 0.070376836 + -0.1151461) * fVar68 + 0.116769984) *
                                 fVar68 + -0.12420141) * fVar68 + 0.14249323) * fVar68 + -0.16668057
                              ) * fVar68 + 0.20000714) * fVar68 + -0.24999994) * fVar68 + 0.3333333)
                           * fVar68 + -0.5) + auVar149._0_4_ * 0.6931472 + fVar68) * -2.0;
                    auVar70._4_4_ =
                         (fVar113 * fVar113 *
                          (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) *
                                 fVar113 + -0.12420141) * fVar113 + 0.14249323) * fVar113 +
                              -0.16668057) * fVar113 + 0.20000714) * fVar113 + -0.24999994) *
                            fVar113 + 0.3333333) * fVar113 + -0.5) +
                         auVar149._4_4_ * 0.6931472 + fVar113) * -2.0;
                    auVar70._8_4_ =
                         (fVar129 * fVar129 *
                          (((((((((fVar129 * 0.070376836 + -0.1151461) * fVar129 + 0.116769984) *
                                 fVar129 + -0.12420141) * fVar129 + 0.14249323) * fVar129 +
                              -0.16668057) * fVar129 + 0.20000714) * fVar129 + -0.24999994) *
                            fVar129 + 0.3333333) * fVar129 + -0.5) +
                         auVar149._8_4_ * 0.6931472 + fVar129) * -2.0;
                    auVar70._12_4_ =
                         (fVar131 * fVar131 *
                          (((((((((fVar131 * 0.070376836 + -0.1151461) * fVar131 + 0.116769984) *
                                 fVar131 + -0.12420141) * fVar131 + 0.14249323) * fVar131 +
                              -0.16668057) * fVar131 + 0.20000714) * fVar131 + -0.24999994) *
                            fVar131 + 0.3333333) * fVar131 + -0.5) +
                         auVar149._12_4_ * 0.6931472 + fVar131) * -2.0;
                    auVar91._8_4_ = 0x7fffffff;
                    auVar91._0_8_ = 0x7fffffff7fffffff;
                    auVar91._12_4_ = 0x7fffffff;
                    auVar114 = vblendvps_avx(auVar70,auVar91,auVar114);
                    auVar92._8_4_ = 0x42b0c0a5;
                    auVar92._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar92._12_4_ = 0x42b0c0a5;
                    auVar114 = vminps_avx(auVar114,auVar92);
                    auVar93._8_4_ = 0xc2b0c0a5;
                    auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar93._12_4_ = 0xc2b0c0a5;
                    auVar84 = vmaxps_avx(auVar114,auVar93);
                    auVar94._0_4_ = auVar84._0_4_ * 1.442695 + 0.5;
                    auVar94._4_4_ = auVar84._4_4_ * 1.442695 + 0.5;
                    auVar94._8_4_ = auVar84._8_4_ * 1.442695 + 0.5;
                    auVar94._12_4_ = auVar84._12_4_ * 1.442695 + 0.5;
                    auVar118._0_4_ = (int)auVar94._0_4_;
                    auVar118._4_4_ = (int)auVar94._4_4_;
                    auVar118._8_4_ = (int)auVar94._8_4_;
                    auVar118._12_4_ = (int)auVar94._12_4_;
                    auVar149 = vcvtdq2ps_avx(auVar118);
                    auVar114 = vcmpps_avx(auVar94,auVar149,1);
                    auVar114 = vandps_avx(auVar114,auVar86);
                    auVar114 = vsubps_avx(auVar149,auVar114);
                    auVar119._0_4_ = auVar114._0_4_ * 0.6931472;
                    auVar119._4_4_ = auVar114._4_4_ * 0.6931472;
                    auVar119._8_4_ = auVar114._8_4_ * 0.6931472;
                    auVar119._12_4_ = auVar114._12_4_ * 0.6931472;
                    auVar102 = ZEXT1664(auVar86);
                    auVar149 = vsubps_avx(auVar84,auVar119);
                    fVar68 = auVar149._0_4_;
                    fVar113 = auVar149._4_4_;
                    fVar129 = auVar149._8_4_;
                    fVar131 = auVar149._12_4_;
                    auVar95._0_4_ = (int)auVar114._0_4_;
                    auVar95._4_4_ = (int)auVar114._4_4_;
                    auVar95._8_4_ = (int)auVar114._8_4_;
                    auVar95._12_4_ = (int)auVar114._12_4_;
                    auVar114 = vpslld_avx(auVar95,0x17);
                    auVar86 = vpaddd_avx(auVar114,auVar86);
                    auVar71._0_4_ =
                         (fVar68 + fVar53 +
                         (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                            fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) *
                         fVar68 * fVar68) * auVar86._0_4_ + fVar53;
                    auVar71._4_4_ =
                         (fVar113 + fVar103 +
                         (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) *
                            fVar113 + 0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5) *
                         fVar113 * fVar113) * auVar86._4_4_ + fVar103;
                    auVar71._8_4_ =
                         (fVar129 + fVar3 +
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) *
                         fVar129 * fVar129) * auVar86._8_4_ + fVar3;
                    auVar71._12_4_ =
                         (fVar131 + fVar83 +
                         (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) *
                            fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5) *
                         fVar131 * fVar131) * auVar86._12_4_ + fVar83;
                    auVar96._8_4_ = 0x40000000;
                    auVar96._0_8_ = 0x4000000040000000;
                    auVar96._12_4_ = 0x40000000;
                    auVar86 = vdivps_avx(auVar96,auVar71);
                    auVar72._0_4_ = auVar86._0_4_ + -1.0;
                    auVar72._4_4_ = auVar86._4_4_ + -1.0;
                    auVar72._8_4_ = auVar86._8_4_ + -1.0;
                    auVar72._12_4_ = auVar86._12_4_ + -1.0;
                    goto LAB_00438af5;
                  case 6:
                    pfVar39 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                    fVar53 = *pfVar39;
                    fVar103 = pfVar39[1];
                    auVar75._0_4_ = fVar53 * auVar62._0_4_ + fVar103;
                    auVar75._4_4_ = fVar53 * fVar60 + fVar103;
                    auVar75._8_4_ = fVar53 * fVar66 + fVar103;
                    auVar75._12_4_ = fVar53 * fVar67 + fVar103;
                    auVar114 = vmaxps_avx(auVar75,_DAT_005a3040);
                    auVar72 = vminps_avx(auVar114,auVar86);
LAB_00438af5:
                    auVar62._0_4_ = auVar72._0_4_ * auVar62._0_4_;
                    auVar62._4_4_ = auVar72._4_4_ * fVar60;
                    auVar62._8_4_ = auVar72._8_4_ * fVar66;
                    auVar62._12_4_ = auVar72._12_4_ * fVar67;
                  }
                  *pauVar45 = auVar62;
                  pauVar45 = pauVar45 + 1;
                  iVar30 = iVar30 + 1;
                  iVar42 = iVar42 + 1;
                } while (iVar30 != _w);
              }
              iVar34 = iVar34 + 1;
            } while (iVar34 != iVar40);
          }
          local_2c8 = local_2c8 + 1;
          local_1e8 = (void *)CONCAT44(local_1e8._4_4_,uVar9);
        } while (local_2c8 != uVar38);
      }
    }
    else if ((iVar41 == 8) && (0 < (int)uVar35)) {
      auVar86 = vpcmpgtd_avx(auVar86,(undefined1  [16])0x0);
      auVar86 = vpmovsxdq_avx(auVar86);
      uVar29 = vmovmskpd_avx(auVar86);
      local_2c8 = 0;
      auVar143 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar144 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar145 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar111._8_4_ = 0x3f000000;
      auVar111._0_8_ = 0x3f0000003f000000;
      auVar111._12_4_ = 0x3f000000;
      auVar111._16_4_ = 0x3f000000;
      auVar111._20_4_ = 0x3f000000;
      auVar111._24_4_ = 0x3f000000;
      auVar111._28_4_ = 0x3f000000;
      auVar106 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar146 = ZEXT3264(CONCAT428(0x3c088908,
                                    CONCAT424(0x3c088908,
                                              CONCAT420(0x3c088908,
                                                        CONCAT416(0x3c088908,
                                                                  CONCAT412(0x3c088908,
                                                                            CONCAT48(0x3c088908,
                                                                                                                                                                          
                                                  0x3c0889083c088908)))))));
      do {
        if ((byte)((byte)uVar29 >> 1) != 0) {
          pvVar48 = (this->weight_data_tm).data;
          sVar51 = bottom_blob->cstep;
          sVar19 = bottom_blob->elemsize;
          pvVar20 = bottom_blob->data;
          iVar41 = bottom_blob->w;
          pauVar44 = (undefined1 (*) [32])
                     (local_238.cstep * local_2c8 * local_238.elemsize + (long)local_238.data);
          local_1d0 = (void *)(local_2c8 * 0x20);
          iVar34 = 0;
          do {
            if ((uVar29 & 1) != 0) {
              iVar30 = 0;
              iVar42 = -iVar52;
              do {
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar152 = ZEXT3264(*(undefined1 (*) [32])
                                       ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                       (long)local_1d0));
                }
                iVar43 = (this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < iVar43) {
                  iVar16 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar35 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar17 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar50 = 0;
                  lVar49 = 0;
                  do {
                    iVar31 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar49 +
                             (iVar34 - iVar37);
                    if ((((-1 < iVar31) && (iVar32 = iVar31 / iVar16, iVar31 % iVar16 == 0)) &&
                        (iVar32 < (int)uVar9)) && (0 < (int)uVar35)) {
                      uVar46 = (ulong)uVar35;
                      uVar47 = uVar50;
                      iVar31 = iVar42;
                      do {
                        if ((-1 < iVar31) &&
                           (iVar33 = iVar31 / iVar17, iVar33 < (int)uVar4 && iVar31 % iVar17 == 0))
                        {
                          pfVar39 = (float *)((long)pvVar48 +
                                             (uVar47 & 0xffffffff) * 4 +
                                             (long)(iVar28 * 8 * (int)local_2c8) * 4);
                          pfVar1 = (float *)((long)pvVar20 +
                                            (long)(iVar33 << 3) * 4 +
                                            (long)iVar32 * (long)iVar41 * sVar19 +
                                            sVar51 * local_2c8 * sVar19);
                          auVar152 = ZEXT3264(CONCAT428(auVar152._28_4_ + pfVar39[7],
                                                        CONCAT424(auVar152._24_4_ +
                                                                  pfVar39[6] * pfVar1[6],
                                                                  CONCAT420(auVar152._20_4_ +
                                                                            pfVar39[5] * pfVar1[5],
                                                                            CONCAT416(auVar152.
                                                  _16_4_ + pfVar39[4] * pfVar1[4],
                                                  CONCAT412(auVar152._12_4_ + pfVar39[3] * pfVar1[3]
                                                            ,CONCAT48(auVar152._8_4_ +
                                                                      pfVar39[2] * pfVar1[2],
                                                                      CONCAT44(auVar152._4_4_ +
                                                                               pfVar39[1] *
                                                                               pfVar1[1],
                                                                               auVar152._0_4_ +
                                                                               *pfVar39 * *pfVar1)))
                                                  )))));
                        }
                        iVar31 = iVar31 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar47 = uVar47 + 8;
                        uVar46 = uVar46 - 1;
                      } while (uVar46 != 0);
                    }
                    lVar49 = lVar49 + 1;
                    uVar50 = uVar50 + (ulong)uVar35 * 8;
                  } while (lVar49 != iVar43);
                }
                auVar151 = auVar152._0_32_;
                fVar154 = auVar152._8_4_;
                fVar155 = auVar152._12_4_;
                fVar156 = auVar152._16_4_;
                fVar157 = auVar152._20_4_;
                fVar158 = auVar152._24_4_;
                fVar113 = auVar145._0_4_;
                fVar129 = auVar145._4_4_;
                fVar131 = auVar145._8_4_;
                fVar133 = auVar145._12_4_;
                fVar135 = auVar145._16_4_;
                fVar137 = auVar145._20_4_;
                fVar139 = auVar145._24_4_;
                auVar58 = auVar106._0_32_;
                fVar112 = auVar146._0_4_;
                fVar128 = auVar146._4_4_;
                fVar130 = auVar146._8_4_;
                fVar132 = auVar146._12_4_;
                fVar134 = auVar146._16_4_;
                fVar136 = auVar146._20_4_;
                fVar138 = auVar146._24_4_;
                fVar147 = auVar146._28_4_;
                auVar82 = auVar144._0_32_;
                fVar53 = auVar106._0_4_;
                fVar103 = auVar106._4_4_;
                fVar3 = auVar106._8_4_;
                fVar83 = auVar106._12_4_;
                fVar60 = auVar106._16_4_;
                fVar66 = auVar106._20_4_;
                fVar67 = auVar106._24_4_;
                fVar68 = auVar106._28_4_;
                auVar153._28_36_ = auVar152._28_36_;
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar151 = vmaxps_avx(auVar151,auVar143._0_32_);
                  break;
                case 2:
                  auVar58 = vmaxps_avx(auVar151,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  in_ZMM7 = ZEXT3264(auVar58);
                  auVar143 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar82 = vminps_avx(auVar151,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  fVar53 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar151._0_4_ = fVar53 * auVar82._0_4_ + auVar58._0_4_;
                  auVar151._4_4_ = fVar53 * auVar82._4_4_ + auVar58._4_4_;
                  auVar151._8_4_ = fVar53 * auVar82._8_4_ + auVar58._8_4_;
                  auVar151._12_4_ = fVar53 * auVar82._12_4_ + auVar58._12_4_;
                  auVar151._16_4_ = fVar53 * auVar82._16_4_ + auVar58._16_4_;
                  auVar151._20_4_ = fVar53 * auVar82._20_4_ + auVar58._20_4_;
                  auVar151._24_4_ = fVar53 * auVar82._24_4_ + auVar58._24_4_;
                  auVar151._28_4_ = auVar82._28_4_ + auVar58._28_4_;
                  break;
                case 3:
                  puVar21 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar2 = *puVar21;
                  auVar125._4_4_ = uVar2;
                  auVar125._0_4_ = uVar2;
                  auVar125._8_4_ = uVar2;
                  auVar125._12_4_ = uVar2;
                  auVar125._16_4_ = uVar2;
                  auVar125._20_4_ = uVar2;
                  auVar125._24_4_ = uVar2;
                  auVar125._28_4_ = uVar2;
                  uVar2 = puVar21[1];
                  auVar164._4_4_ = uVar2;
                  auVar164._0_4_ = uVar2;
                  auVar164._8_4_ = uVar2;
                  auVar164._12_4_ = uVar2;
                  auVar164._16_4_ = uVar2;
                  auVar164._20_4_ = uVar2;
                  auVar164._24_4_ = uVar2;
                  auVar164._28_4_ = uVar2;
                  auVar151 = vmaxps_avx(auVar151,auVar125);
                  in_ZMM7 = ZEXT3264(auVar151);
                  auVar151 = vminps_avx(auVar164,auVar151);
                  break;
                case 4:
                  auVar126._0_8_ = auVar152._0_8_ ^ 0x8000000080000000;
                  auVar126._8_4_ = -fVar154;
                  auVar126._12_4_ = -fVar155;
                  auVar126._16_4_ = -fVar156;
                  auVar126._20_4_ = -fVar157;
                  auVar126._24_4_ = -fVar158;
                  auVar126._28_4_ = -auVar152._28_4_;
                  auVar59._8_4_ = 0x42b0c0a5;
                  auVar59._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar59._12_4_ = 0x42b0c0a5;
                  auVar59._16_4_ = 0x42b0c0a5;
                  auVar59._20_4_ = 0x42b0c0a5;
                  auVar59._24_4_ = 0x42b0c0a5;
                  auVar59._28_4_ = 0x42b0c0a5;
                  auVar151 = vminps_avx(auVar126,auVar59);
                  auVar82 = vmaxps_avx(auVar82,auVar151);
                  auVar150._0_4_ = fVar113 * auVar82._0_4_ + 0.5;
                  auVar150._4_4_ = fVar129 * auVar82._4_4_ + 0.5;
                  auVar150._8_4_ = fVar131 * auVar82._8_4_ + 0.5;
                  auVar150._12_4_ = fVar133 * auVar82._12_4_ + 0.5;
                  auVar150._16_4_ = fVar135 * auVar82._16_4_ + 0.5;
                  auVar150._20_4_ = fVar137 * auVar82._20_4_ + 0.5;
                  auVar150._24_4_ = fVar139 * auVar82._24_4_ + 0.5;
                  auVar150._28_4_ = auVar152._28_4_ + 0.5;
                  auVar101 = vroundps_avx(auVar150,1);
                  auVar151 = vcmpps_avx(auVar150,auVar101,1);
                  auVar151 = vandps_avx(auVar151,auVar58);
                  auVar151 = vsubps_avx(auVar101,auVar151);
                  fVar113 = auVar151._0_4_ * -0.6931472 + auVar82._0_4_;
                  fVar129 = auVar151._4_4_ * -0.6931472 + auVar82._4_4_;
                  fVar131 = auVar151._8_4_ * -0.6931472 + auVar82._8_4_;
                  fVar133 = auVar151._12_4_ * -0.6931472 + auVar82._12_4_;
                  fVar135 = auVar151._16_4_ * -0.6931472 + auVar82._16_4_;
                  fVar137 = auVar151._20_4_ * -0.6931472 + auVar82._20_4_;
                  fVar139 = auVar151._24_4_ * -0.6931472 + auVar82._24_4_;
                  auVar115._0_4_ = (int)auVar151._0_4_;
                  auVar115._4_4_ = (int)auVar151._4_4_;
                  auVar115._8_4_ = (int)auVar151._8_4_;
                  auVar115._12_4_ = (int)auVar151._12_4_;
                  auVar127._16_4_ = (int)auVar151._16_4_;
                  auVar127._0_16_ = auVar115;
                  auVar127._20_4_ = (int)auVar151._20_4_;
                  auVar127._24_4_ = (int)auVar151._24_4_;
                  auVar127._28_4_ = (int)auVar151._28_4_;
                  auVar114 = vpslld_avx(auVar115,0x17);
                  auVar86 = vpslld_avx(auVar127._16_16_,0x17);
                  auVar61._8_4_ = 0x3f800000;
                  auVar61._0_8_ = 0x3f8000003f800000;
                  auVar61._12_4_ = 0x3f800000;
                  auVar86 = vpaddd_avx(auVar86,auVar61);
                  auVar114 = vpaddd_avx(auVar114,auVar61);
                  in_ZMM7 = ZEXT3264(CONCAT1616(auVar86,auVar114));
                  auVar81._0_4_ =
                       (fVar113 + fVar53 +
                       fVar113 * fVar113 *
                       ((((fVar112 + (fVar113 * 0.00019875691 + 0.0013981999) * fVar113) * fVar113 +
                         0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar114._0_4_ +
                       fVar53;
                  auVar81._4_4_ =
                       (fVar129 + fVar103 +
                       fVar129 * fVar129 *
                       ((((fVar128 + (fVar129 * 0.00019875691 + 0.0013981999) * fVar129) * fVar129 +
                         0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar114._4_4_ +
                       fVar103;
                  auVar81._8_4_ =
                       (fVar131 + fVar3 +
                       fVar131 * fVar131 *
                       ((((fVar130 + (fVar131 * 0.00019875691 + 0.0013981999) * fVar131) * fVar131 +
                         0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar114._8_4_ +
                       fVar3;
                  auVar81._12_4_ =
                       (fVar133 + fVar83 +
                       fVar133 * fVar133 *
                       ((((fVar132 + (fVar133 * 0.00019875691 + 0.0013981999) * fVar133) * fVar133 +
                         0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar114._12_4_ +
                       fVar83;
                  auVar81._16_4_ =
                       (fVar135 + fVar60 +
                       fVar135 * fVar135 *
                       ((((fVar134 + (fVar135 * 0.00019875691 + 0.0013981999) * fVar135) * fVar135 +
                         0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar86._0_4_ +
                       fVar60;
                  auVar81._20_4_ =
                       (fVar137 + fVar66 +
                       fVar137 * fVar137 *
                       ((((fVar136 + (fVar137 * 0.00019875691 + 0.0013981999) * fVar137) * fVar137 +
                         0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar86._4_4_ +
                       fVar66;
                  auVar81._24_4_ =
                       (fVar139 + fVar67 +
                       fVar139 * fVar139 *
                       ((((fVar138 + (fVar139 * 0.00019875691 + 0.0013981999) * fVar139) * fVar139 +
                         0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5)) * auVar86._8_4_ +
                       fVar67;
                  auVar81._28_4_ =
                       auVar101._28_4_ + auVar82._28_4_ + fVar68 +
                       fVar147 + -0.691749 + 0.041665796 + 0.16666666 + 0.5 + fVar68;
                  auVar151 = vdivps_avx(auVar58,auVar81);
                  break;
                case 5:
                  auVar142._8_4_ = 0x42b0c0a5;
                  auVar142._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar142._12_4_ = 0x42b0c0a5;
                  auVar142._16_4_ = 0x42b0c0a5;
                  auVar142._20_4_ = 0x42b0c0a5;
                  auVar142._24_4_ = 0x42b0c0a5;
                  auVar142._28_4_ = 0x42b0c0a5;
                  auVar151 = vminps_avx(auVar151,auVar142);
                  auVar101 = vmaxps_avx(auVar82,auVar151);
                  auVar123._0_4_ = fVar113 * auVar101._0_4_ + 0.5;
                  auVar123._4_4_ = fVar129 * auVar101._4_4_ + 0.5;
                  auVar123._8_4_ = fVar131 * auVar101._8_4_ + 0.5;
                  auVar123._12_4_ = fVar133 * auVar101._12_4_ + 0.5;
                  auVar123._16_4_ = fVar135 * auVar101._16_4_ + 0.5;
                  auVar123._20_4_ = fVar137 * auVar101._20_4_ + 0.5;
                  auVar123._24_4_ = fVar139 * auVar101._24_4_ + 0.5;
                  auVar123._28_4_ = in_ZMM7._28_4_ + 0.5;
                  auVar55 = vroundps_avx(auVar123,1);
                  auVar151 = vcmpps_avx(auVar123,auVar55,1);
                  auVar151 = vandps_avx(auVar151,auVar58);
                  auVar151 = vsubps_avx(auVar55,auVar151);
                  auVar23._4_4_ = auVar151._4_4_ * 0.6931472;
                  auVar23._0_4_ = auVar151._0_4_ * 0.6931472;
                  auVar23._8_4_ = auVar151._8_4_ * 0.6931472;
                  auVar23._12_4_ = auVar151._12_4_ * 0.6931472;
                  auVar23._16_4_ = auVar151._16_4_ * 0.6931472;
                  auVar23._20_4_ = auVar151._20_4_ * 0.6931472;
                  auVar23._24_4_ = auVar151._24_4_ * 0.6931472;
                  auVar23._28_4_ = auVar55._28_4_;
                  auVar101 = vsubps_avx(auVar101,auVar23);
                  fVar159 = auVar101._0_4_;
                  fVar165 = auVar101._4_4_;
                  fVar166 = auVar101._8_4_;
                  fVar167 = auVar101._12_4_;
                  fVar168 = auVar101._16_4_;
                  fVar169 = auVar101._20_4_;
                  fVar170 = auVar101._24_4_;
                  auVar85._0_4_ = (int)auVar151._0_4_;
                  auVar85._4_4_ = (int)auVar151._4_4_;
                  auVar85._8_4_ = (int)auVar151._8_4_;
                  auVar85._12_4_ = (int)auVar151._12_4_;
                  auVar97._16_4_ = (int)auVar151._16_4_;
                  auVar97._0_16_ = auVar85;
                  auVar97._20_4_ = (int)auVar151._20_4_;
                  auVar97._24_4_ = (int)auVar151._24_4_;
                  auVar97._28_4_ = (int)auVar151._28_4_;
                  auVar114 = vpslld_avx(auVar85,0x17);
                  auVar86 = vpslld_avx(auVar97._16_16_,0x17);
                  auVar108._8_4_ = 0x3f800000;
                  auVar108._0_8_ = 0x3f8000003f800000;
                  auVar108._12_4_ = 0x3f800000;
                  auVar86 = vpaddd_avx(auVar86,auVar108);
                  auVar114 = vpaddd_avx(auVar114,auVar108);
                  auVar124._0_4_ =
                       (fVar159 + fVar53 +
                       fVar159 * fVar159 *
                       ((((fVar112 + (fVar159 * 0.00019875691 + 0.0013981999) * fVar159) * fVar159 +
                         0.041665796) * fVar159 + 0.16666666) * fVar159 + 0.5)) * auVar114._0_4_ +
                       fVar53;
                  auVar124._4_4_ =
                       (fVar165 + fVar103 +
                       fVar165 * fVar165 *
                       ((((fVar128 + (fVar165 * 0.00019875691 + 0.0013981999) * fVar165) * fVar165 +
                         0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5)) * auVar114._4_4_ +
                       fVar103;
                  auVar124._8_4_ =
                       (fVar166 + fVar3 +
                       fVar166 * fVar166 *
                       ((((fVar130 + (fVar166 * 0.00019875691 + 0.0013981999) * fVar166) * fVar166 +
                         0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) * auVar114._8_4_ +
                       fVar3;
                  auVar124._12_4_ =
                       (fVar167 + fVar83 +
                       fVar167 * fVar167 *
                       ((((fVar132 + (fVar167 * 0.00019875691 + 0.0013981999) * fVar167) * fVar167 +
                         0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) * auVar114._12_4_ +
                       fVar83;
                  auVar124._16_4_ =
                       (fVar168 + fVar60 +
                       fVar168 * fVar168 *
                       ((((fVar134 + (fVar168 * 0.00019875691 + 0.0013981999) * fVar168) * fVar168 +
                         0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5)) * auVar86._0_4_ +
                       fVar60;
                  auVar124._20_4_ =
                       (fVar169 + fVar66 +
                       fVar169 * fVar169 *
                       ((((fVar136 + (fVar169 * 0.00019875691 + 0.0013981999) * fVar169) * fVar169 +
                         0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5)) * auVar86._4_4_ +
                       fVar66;
                  auVar124._24_4_ =
                       (fVar170 + fVar67 +
                       fVar170 * fVar170 *
                       ((((fVar138 + (fVar170 * 0.00019875691 + 0.0013981999) * fVar170) * fVar170 +
                         0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5)) * auVar86._8_4_ +
                       fVar67;
                  auVar124._28_4_ =
                       auVar101._28_4_ + fVar68 +
                       fVar147 + auVar102._28_4_ + 0.0013981999 + 0.041665796 + 0.16666666 + 0.5 +
                       fVar68;
                  auVar55._8_4_ = 0x800000;
                  auVar55._0_8_ = 0x80000000800000;
                  auVar55._12_4_ = 0x800000;
                  auVar55._16_4_ = 0x800000;
                  auVar55._20_4_ = 0x800000;
                  auVar55._24_4_ = 0x800000;
                  auVar55._28_4_ = 0x800000;
                  auVar55 = vmaxps_avx(auVar124,auVar55);
                  auVar86 = vpsrld_avx(auVar55._16_16_,0x17);
                  auVar56._8_4_ = 0x807fffff;
                  auVar56._0_8_ = 0x807fffff807fffff;
                  auVar56._12_4_ = 0x807fffff;
                  auVar56._16_4_ = 0x807fffff;
                  auVar56._20_4_ = 0x807fffff;
                  auVar56._24_4_ = 0x807fffff;
                  auVar56._28_4_ = 0x807fffff;
                  auVar151 = vandps_avx(auVar55,auVar56);
                  auVar23 = vorps_avx(auVar151,auVar111);
                  auVar57._8_4_ = 0x3f3504f3;
                  auVar57._0_8_ = 0x3f3504f33f3504f3;
                  auVar57._12_4_ = 0x3f3504f3;
                  auVar57._16_4_ = 0x3f3504f3;
                  auVar57._20_4_ = 0x3f3504f3;
                  auVar57._24_4_ = 0x3f3504f3;
                  auVar57._28_4_ = 0x3f3504f3;
                  auVar101 = vcmpps_avx(auVar57,auVar23,2);
                  auVar151 = vandnps_avx(auVar101,auVar23);
                  fVar159 = auVar23._0_4_ + -1.0 + auVar151._0_4_;
                  fVar165 = auVar23._4_4_ + -1.0 + auVar151._4_4_;
                  fVar166 = auVar23._8_4_ + -1.0 + auVar151._8_4_;
                  fVar167 = auVar23._12_4_ + -1.0 + auVar151._12_4_;
                  fVar168 = auVar23._16_4_ + -1.0 + auVar151._16_4_;
                  fVar169 = auVar23._20_4_ + -1.0 + auVar151._20_4_;
                  fVar170 = auVar23._24_4_ + -1.0 + auVar151._24_4_;
                  auVar86 = vpsubd_avx(auVar86,auVar101._16_16_);
                  auVar114 = vpsrld_avx(auVar55._0_16_,0x17);
                  auVar140._8_4_ = 0xffffff81;
                  auVar140._0_8_ = 0xffffff81ffffff81;
                  auVar140._12_4_ = 0xffffff81;
                  auVar86 = vpaddd_avx(auVar140,auVar86);
                  auVar114 = vpsubd_avx(auVar114,auVar101._0_16_);
                  auVar114 = vpaddd_avx(auVar140,auVar114);
                  auVar79._16_16_ = auVar86;
                  auVar79._0_16_ = auVar114;
                  auVar143 = ZEXT864(0) << 0x20;
                  auVar101 = vcmpps_avx(auVar124,_DAT_005a6f60,2);
                  auVar55 = vcvtdq2ps_avx(auVar79);
                  auVar24._4_4_ =
                       (fVar165 + auVar55._4_4_ * 0.6931472 +
                       fVar165 * fVar165 *
                       (fVar165 * (fVar165 * (fVar165 * (fVar165 * (fVar165 * (fVar165 * (fVar165 * 
                                                  (fVar165 * (fVar165 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar24._0_4_ =
                       (fVar159 + auVar55._0_4_ * 0.6931472 +
                       fVar159 * fVar159 *
                       (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * (fVar159 * 
                                                  (fVar159 * (fVar159 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar24._8_4_ =
                       (fVar166 + auVar55._8_4_ * 0.6931472 +
                       fVar166 * fVar166 *
                       (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * (fVar166 * 
                                                  (fVar166 * (fVar166 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar24._12_4_ =
                       (fVar167 + auVar55._12_4_ * 0.6931472 +
                       fVar167 * fVar167 *
                       (fVar167 * (fVar167 * (fVar167 * (fVar167 * (fVar167 * (fVar167 * (fVar167 * 
                                                  (fVar167 * (fVar167 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar24._16_4_ =
                       (fVar168 + auVar55._16_4_ * 0.6931472 +
                       fVar168 * fVar168 *
                       (fVar168 * (fVar168 * (fVar168 * (fVar168 * (fVar168 * (fVar168 * (fVar168 * 
                                                  (fVar168 * (fVar168 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar24._20_4_ =
                       (fVar169 + auVar55._20_4_ * 0.6931472 +
                       fVar169 * fVar169 *
                       (fVar169 * (fVar169 * (fVar169 * (fVar169 * (fVar169 * (fVar169 * (fVar169 * 
                                                  (fVar169 * (fVar169 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar24._24_4_ =
                       (fVar170 + auVar55._24_4_ * 0.6931472 +
                       fVar170 * fVar170 *
                       (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * 
                                                  (fVar170 * (fVar170 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar24._28_4_ = auVar23._28_4_ + -1.0 + auVar151._28_4_ + auVar55._28_4_ + 0.0;
                  auVar98._8_4_ = 0x7fffffff;
                  auVar98._0_8_ = 0x7fffffff7fffffff;
                  auVar98._12_4_ = 0x7fffffff;
                  auVar98._16_4_ = 0x7fffffff;
                  auVar98._20_4_ = 0x7fffffff;
                  auVar98._24_4_ = 0x7fffffff;
                  auVar98._28_4_ = 0x7fffffff;
                  auVar151 = vblendvps_avx(auVar24,auVar98,auVar101);
                  auVar151 = vminps_avx(auVar142,auVar151);
                  auVar144 = ZEXT3264(auVar82);
                  auVar82 = vmaxps_avx(auVar82,auVar151);
                  auVar145 = ZEXT3264(auVar145._0_32_);
                  auVar99._0_4_ = fVar113 * auVar82._0_4_ + 0.5;
                  auVar99._4_4_ = fVar129 * auVar82._4_4_ + 0.5;
                  auVar99._8_4_ = fVar131 * auVar82._8_4_ + 0.5;
                  auVar99._12_4_ = fVar133 * auVar82._12_4_ + 0.5;
                  auVar99._16_4_ = fVar135 * auVar82._16_4_ + 0.5;
                  auVar99._20_4_ = fVar137 * auVar82._20_4_ + 0.5;
                  auVar99._24_4_ = fVar139 * auVar82._24_4_ + 0.5;
                  auVar99._28_4_ = 0x7fc00000;
                  auVar55 = vroundps_avx(auVar99,1);
                  auVar151 = vcmpps_avx(auVar99,auVar55,1);
                  auVar151 = vandps_avx(auVar151,auVar58);
                  auVar151 = vsubps_avx(auVar55,auVar151);
                  auVar25._4_4_ = auVar151._4_4_ * 0.6931472;
                  auVar25._0_4_ = auVar151._0_4_ * 0.6931472;
                  auVar25._8_4_ = auVar151._8_4_ * 0.6931472;
                  auVar25._12_4_ = auVar151._12_4_ * 0.6931472;
                  auVar25._16_4_ = auVar151._16_4_ * 0.6931472;
                  auVar25._20_4_ = auVar151._20_4_ * 0.6931472;
                  auVar25._24_4_ = auVar151._24_4_ * 0.6931472;
                  auVar25._28_4_ = auVar55._28_4_;
                  auVar82 = vsubps_avx(auVar82,auVar25);
                  fVar113 = auVar82._0_4_;
                  fVar129 = auVar82._4_4_;
                  fVar131 = auVar82._8_4_;
                  fVar133 = auVar82._12_4_;
                  fVar135 = auVar82._16_4_;
                  fVar137 = auVar82._20_4_;
                  fVar139 = auVar82._24_4_;
                  auVar146 = ZEXT3264(auVar146._0_32_);
                  fVar112 = ((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + fVar112) *
                              fVar113 + 0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5;
                  fVar128 = ((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + fVar128) *
                              fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5;
                  fVar130 = ((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + fVar130) *
                              fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5;
                  fVar132 = ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + fVar132) *
                              fVar133 + 0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5;
                  fVar134 = ((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + fVar134) *
                              fVar135 + 0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5;
                  fVar136 = ((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + fVar136) *
                              fVar137 + 0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5;
                  fVar138 = ((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + fVar138) *
                              fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5;
                  in_ZMM7 = ZEXT3264(CONCAT428(auVar124._28_4_ + 0.0013981999 + fVar147 +
                                               0.041665796 + 0.16666666 + 0.5,
                                               CONCAT424(fVar138,CONCAT420(fVar136,CONCAT416(fVar134
                                                  ,CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(
                                                  fVar128,fVar112))))))));
                  auVar87._0_4_ = (int)auVar151._0_4_;
                  auVar87._4_4_ = (int)auVar151._4_4_;
                  auVar87._8_4_ = (int)auVar151._8_4_;
                  auVar87._12_4_ = (int)auVar151._12_4_;
                  auVar100._16_4_ = (int)auVar151._16_4_;
                  auVar100._0_16_ = auVar87;
                  auVar100._20_4_ = (int)auVar151._20_4_;
                  auVar100._24_4_ = (int)auVar151._24_4_;
                  auVar100._28_4_ = (int)auVar151._28_4_;
                  auVar114 = vpslld_avx(auVar87,0x17);
                  auVar86 = vpslld_avx(auVar100._16_16_,0x17);
                  auVar54._8_4_ = 0x3f800000;
                  auVar54._0_8_ = 0x3f8000003f800000;
                  auVar54._12_4_ = 0x3f800000;
                  auVar86 = vpaddd_avx(auVar86,auVar54);
                  auVar114 = vpaddd_avx(auVar114,auVar54);
                  auVar101._16_16_ = auVar86;
                  auVar101._0_16_ = auVar114;
                  auVar106 = ZEXT3264(auVar58);
                  auVar80._0_4_ =
                       (fVar113 + fVar53 + fVar113 * fVar113 * fVar112) * auVar114._0_4_ + fVar53;
                  auVar80._4_4_ =
                       (fVar129 + fVar103 + fVar129 * fVar129 * fVar128) * auVar114._4_4_ + fVar103;
                  auVar80._8_4_ =
                       (fVar131 + fVar3 + fVar131 * fVar131 * fVar130) * auVar114._8_4_ + fVar3;
                  auVar80._12_4_ =
                       (fVar133 + fVar83 + fVar133 * fVar133 * fVar132) * auVar114._12_4_ + fVar83;
                  auVar80._16_4_ =
                       (fVar135 + fVar60 + fVar135 * fVar135 * fVar134) * auVar86._0_4_ + fVar60;
                  auVar80._20_4_ =
                       (fVar137 + fVar66 + fVar137 * fVar137 * fVar136) * auVar86._4_4_ + fVar66;
                  auVar80._24_4_ =
                       (fVar139 + fVar67 + fVar139 * fVar139 * fVar138) * auVar86._8_4_ + fVar67;
                  auVar80._28_4_ = auVar82._28_4_ + fVar68 + auVar55._28_4_ + fVar68;
                  auVar58._8_4_ = 0x40000000;
                  auVar58._0_8_ = 0x4000000040000000;
                  auVar58._12_4_ = 0x40000000;
                  auVar58._16_4_ = 0x40000000;
                  auVar58._20_4_ = 0x40000000;
                  auVar58._24_4_ = 0x40000000;
                  auVar58._28_4_ = 0x40000000;
                  auVar151 = vdivps_avx(auVar58,auVar80);
                  auVar78._0_4_ = auVar151._0_4_ + -1.0;
                  auVar78._4_4_ = auVar151._4_4_ + -1.0;
                  auVar78._8_4_ = auVar151._8_4_ + -1.0;
                  auVar78._12_4_ = auVar151._12_4_ + -1.0;
                  auVar78._16_4_ = auVar151._16_4_ + -1.0;
                  auVar78._20_4_ = auVar151._20_4_ + -1.0;
                  auVar78._24_4_ = auVar151._24_4_ + -1.0;
                  goto LAB_00437e97;
                case 6:
                  pfVar39 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  fVar53 = *pfVar39;
                  fVar103 = pfVar39[1];
                  auVar101._4_4_ = fVar103;
                  auVar101._0_4_ = fVar103;
                  auVar101._8_4_ = fVar103;
                  auVar101._12_4_ = fVar103;
                  auVar101._16_4_ = fVar103;
                  auVar101._20_4_ = fVar103;
                  auVar101._24_4_ = fVar103;
                  auVar101._28_4_ = fVar103;
                  auVar82._0_4_ = auVar152._0_4_ * fVar53 + fVar103;
                  auVar82._4_4_ = auVar152._4_4_ * fVar53 + fVar103;
                  auVar82._8_4_ = fVar154 * fVar53 + fVar103;
                  auVar82._12_4_ = fVar155 * fVar53 + fVar103;
                  auVar82._16_4_ = fVar156 * fVar53 + fVar103;
                  auVar82._20_4_ = fVar157 * fVar53 + fVar103;
                  auVar82._24_4_ = fVar158 * fVar53 + fVar103;
                  auVar82._28_4_ = fVar53 + fVar103;
                  auVar151 = vmaxps_avx(auVar143._0_32_,auVar82);
                  auVar151 = vminps_avx(auVar151,auVar58);
                  auVar78 = auVar151._0_28_;
LAB_00437e97:
                  auVar102 = ZEXT3264(auVar101);
                  auVar153._0_4_ = auVar152._0_4_ * auVar78._0_4_;
                  auVar153._4_4_ = auVar152._4_4_ * auVar78._4_4_;
                  auVar153._8_4_ = fVar154 * auVar78._8_4_;
                  auVar153._12_4_ = fVar155 * auVar78._12_4_;
                  auVar153._16_4_ = fVar156 * auVar78._16_4_;
                  auVar153._20_4_ = fVar157 * auVar78._20_4_;
                  auVar153._24_4_ = fVar158 * auVar78._24_4_;
                  auVar151 = auVar153._0_32_;
                }
                *pauVar44 = auVar151;
                pauVar44 = pauVar44 + 1;
                iVar30 = iVar30 + 1;
                iVar42 = iVar42 + 1;
              } while (iVar30 != _w);
            }
            iVar34 = iVar34 + 1;
          } while (iVar34 != iVar40);
        }
        local_2c8 = local_2c8 + 1;
        local_1e8 = (void *)CONCAT44(local_1e8._4_4_,uVar9);
      } while (local_2c8 != uVar38);
    }
  }
  else {
    uVar35 = (int)(iVar41 * uVar35) / iVar28;
    uVar36 = iVar37 / iVar28;
    local_298 = 1;
    local_2d8 = 1;
    if (opt->use_packing_layout == true) {
      local_298 = (uint)((uVar35 & 3) == 0) * 3 + 1;
      if ((uVar35 & 7) == 0) {
        local_298 = 8;
      }
      local_2d8 = (uint)((uVar36 & 3) == 0) * 3 + 1;
      if ((uVar36 & 7) == 0) {
        local_2d8 = 8;
      }
    }
    piVar18 = bottom_blob->refcount;
    local_178.data = bottom_blob->data;
    local_178.refcount = bottom_blob->refcount;
    local_178.elemsize = bottom_blob->elemsize;
    local_178.elempack = bottom_blob->elempack;
    local_178.allocator = bottom_blob->allocator;
    local_178.dims = bottom_blob->dims;
    local_178.w = bottom_blob->w;
    local_178.h = bottom_blob->h;
    local_178.d = bottom_blob->d;
    local_178.c = bottom_blob->c;
    local_178.cstep = bottom_blob->cstep;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + 1;
      UNLOCK();
    }
    if (local_298 < iVar41) {
      local_1c8.data = *(void **)opt;
      local_1c8.elemsize = (size_t)opt->workspace_allocator;
      local_1c8.elempack = opt->openmp_blocktime;
      local_1c8._28_1_ = opt->use_winograd_convolution;
      local_1c8._29_1_ = opt->use_sgemm_convolution;
      local_1c8._30_1_ = opt->use_int8_inference;
      local_1c8._31_1_ = opt->use_vulkan_compute;
      local_1c8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1c8._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_1c8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1c8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1c8.refcount = (int *)opt->workspace_allocator;
      convert_packing(bottom_blob,&local_178,local_298,(Option *)&local_1c8);
      if (local_178.data == (void *)0x0) {
        iVar37 = -100;
        bVar26 = false;
      }
      else {
        if ((long)local_178.c * local_178.cstep != 0) goto LAB_00438048;
        bVar26 = false;
        iVar37 = -100;
      }
    }
    else {
LAB_00438048:
      piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      local_1c8.refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      local_1c8.data = local_238.data;
      local_1c8.elemsize = local_238.elemsize;
      local_1c8.elempack = local_238.elempack;
      local_1c8.allocator = local_238.allocator;
      local_1c8.w = local_238.w;
      local_1c8.dims = local_238.dims;
      local_1c8.h = local_238.h;
      local_1c8.d = local_238.d;
      local_1c8.c = local_238.c;
      local_1c8.cstep = local_238.cstep;
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + 1;
        UNLOCK();
      }
      if (local_2d8 < uVar29) {
        Mat::create(&local_1c8,_w,iVar40,
                    (this->super_DeconvolutionDepthWise).num_output / (int)local_2d8,
                    (ulong)local_2d8 * (sVar51 / uVar29),local_2d8,opt->workspace_allocator);
        iVar37 = -100;
        if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0))
        goto LAB_00438147;
LAB_0043843d:
        bVar26 = false;
      }
      else {
LAB_00438147:
        if (0 < (this->super_DeconvolutionDepthWise).group) {
          local_1e8._0_4_ = (int)uVar35 / local_298;
          iVar40 = 0;
          iVar41 = 0;
          lVar49 = 0;
          do {
            local_c0 = (void *)((long)(iVar40 / local_298) * local_178.cstep * local_178.elemsize +
                               (long)local_178.data);
            local_b8 = (int *)0x0;
            local_b0 = local_178.elemsize;
            local_a8 = local_178.elempack;
            local_a0 = local_178.allocator;
            local_88 = (int)local_1e8;
            local_80 = ((long)local_178.d * local_178.elemsize *
                        (long)local_178.h * (long)local_178.w + 0xf & 0xfffffffffffffff0) /
                       local_178.elemsize;
            local_98 = local_178.dims;
            iStack_94 = local_178.w;
            iStack_90 = local_178.h;
            iStack_8c = local_178.d;
            local_108 = (void *)((long)(iVar41 / (int)local_2d8) * local_1c8.cstep *
                                 local_1c8.elemsize + (long)local_1c8.data);
            local_100 = (int *)0x0;
            local_f8 = (Allocator *)local_1c8.elemsize;
            local_f0 = local_1c8.elempack;
            local_e8 = local_1c8.allocator;
            local_c8 = ((long)local_1c8.d * local_1c8.elemsize *
                        (long)local_1c8.h * (long)local_1c8.w + 0xf & 0xfffffffffffffff0) /
                       local_1c8.elemsize;
            local_e0 = local_1c8.dims;
            iStack_dc = local_1c8.w;
            iStack_d8 = local_1c8.h;
            iStack_d4 = local_1c8.d;
            pLVar22 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar49];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = local_1c8.allocator;
            local_d0 = (int)uVar36 / (int)local_2d8;
            iVar37 = (*pLVar22->_vptr_Layer[7])(pLVar22,&local_c0,&local_108,&local_78);
            if (local_100 != (int *)0x0) {
              LOCK();
              *local_100 = *local_100 + -1;
              UNLOCK();
              if (*local_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            if (local_b8 != (int *)0x0) {
              LOCK();
              *local_b8 = *local_b8 + -1;
              UNLOCK();
              if (*local_b8 == 0) {
                if (local_a0 == (Allocator *)0x0) {
                  if (local_c0 != (void *)0x0) {
                    free(local_c0);
                  }
                }
                else {
                  (*local_a0->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar37 != 0) goto LAB_0043843d;
            lVar49 = lVar49 + 1;
            iVar41 = iVar41 + uVar36;
            iVar40 = iVar40 + uVar35;
          } while (lVar49 < (this->super_DeconvolutionDepthWise).group);
        }
        if (local_2d8 < uVar29) {
          convert_packing(&local_1c8,&local_238,uVar29,opt);
          iVar37 = -100;
          if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
          goto LAB_0043843d;
        }
        else {
          if ((Allocator *)local_1c8.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_1c8.refcount =
                 *(int *)(_func_int ***)local_1c8.refcount + 1;
            UNLOCK();
          }
          piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
          if (piVar18 != (int *)0x0) {
            LOCK();
            *piVar18 = *piVar18 + -1;
            UNLOCK();
            if (*piVar18 == 0) {
              if (local_238.allocator == (Allocator *)0x0) {
                if (local_238.data != (void *)0x0) {
                  free(local_238.data);
                }
              }
              else {
                (*(local_238.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_238.data = local_1c8.data;
          local_238.refcount._0_4_ = SUB84(local_1c8.refcount,0);
          local_238.refcount._4_4_ = (undefined4)((ulong)local_1c8.refcount >> 0x20);
          local_238.elemsize = local_1c8.elemsize;
          local_238.elempack = local_1c8.elempack;
          local_238.allocator = local_1c8.allocator;
          local_238.dims = local_1c8.dims;
          local_238.w = local_1c8.w;
          local_238.h = local_1c8.h;
          local_238.d = local_1c8.d;
          local_238.c = local_1c8.c;
          local_238.cstep = local_1c8.cstep;
        }
        iVar37 = -100;
        bVar26 = true;
      }
      if ((Allocator *)local_1c8.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_1c8.refcount = *(int *)(_func_int ***)local_1c8.refcount + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_1c8.refcount == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            if (local_1c8.data != (void *)0x0) {
              free(local_1c8.data);
            }
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_178.refcount != (int *)0x0) {
      LOCK();
      *local_178.refcount = *local_178.refcount + -1;
      UNLOCK();
      if (*local_178.refcount == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar26) goto LAB_00439161;
  }
  pMVar27 = local_180;
  DeconvolutionDepthWise::cut_padding(&this->super_DeconvolutionDepthWise,&local_238,local_180,opt);
  if ((pMVar27->data == (void *)0x0) || (iVar37 = 0, (long)local_180->c * local_180->cstep == 0)) {
    iVar37 = -100;
  }
LAB_00439161:
  piVar18 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}